

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ResizeBilinearLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_resizebilinear(NeuralNetworkLayer *this)

{
  bool bVar1;
  ResizeBilinearLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_resizebilinear(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_resizebilinear(this);
    this_00 = (ResizeBilinearLayerParams *)operator_new(0x38);
    ResizeBilinearLayerParams::ResizeBilinearLayerParams(this_00);
    (this->layer_).resizebilinear_ = this_00;
  }
  return (ResizeBilinearLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ResizeBilinearLayerParams* NeuralNetworkLayer::mutable_resizebilinear() {
  if (!has_resizebilinear()) {
    clear_layer();
    set_has_resizebilinear();
    layer_.resizebilinear_ = new ::CoreML::Specification::ResizeBilinearLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.resizeBilinear)
  return layer_.resizebilinear_;
}